

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void __thiscall gnilk::LogManager::AddSink(LogManager *this,Ref *sink,string *name)

{
  unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> local_40;
  __shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::mutex::lock(&this->sinkLock);
  std::__shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&sink->super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>);
  LogSinkInstanceManaged::Create((LogSinkInstanceManaged *)&local_40,(Ref *)&local_38,name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::
  vector<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>,std::allocator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>>>
  ::
  emplace_back<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>>
            ((vector<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>,std::allocator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>>>
              *)&this->sinks,&local_40);
  if (this->isInitialized == true) {
    (*((sink->super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_LogSink
      [8])();
  }
  if ((tuple<gnilk::LogSinkInstance_*,_std::default_delete<gnilk::LogSinkInstance>_>)
      local_40._M_t.
      super___uniq_ptr_impl<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>.
      _M_t.
      super__Tuple_impl<0UL,_gnilk::LogSinkInstance_*,_std::default_delete<gnilk::LogSinkInstance>_>
      .super__Head_base<0UL,_gnilk::LogSinkInstance_*,_false>._M_head_impl !=
      (_Head_base<0UL,_gnilk::LogSinkInstance_*,_false>)0x0) {
    (**(code **)(*(_func_int **)
                  local_40._M_t.
                  super___uniq_ptr_impl<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gnilk::LogSinkInstance_*,_std::default_delete<gnilk::LogSinkInstance>_>
                  .super__Head_base<0UL,_gnilk::LogSinkInstance_*,_false>._M_head_impl + 8))();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->sinkLock);
  return;
}

Assistant:

void LogManager::AddSink(LogSink::Ref sink, const std::string &name) {
    std::lock_guard<std::mutex> lock(sinkLock);
    auto sinkInstance = LogSinkInstanceManaged::Create(sink, name);
    sinks.push_back(std::move(sinkInstance));
    // FIXME: This is not good - we can't do this during initialization
    if (isInitialized) {
        sink->OnAttached();
    }
}